

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O0

streampos __thiscall
booster::streambuf::seekoff(streambuf *this,streamoff off,seekdir seekdir,openmode param_4)

{
  bool bVar1;
  int iVar2;
  io_device *piVar3;
  int in_EDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  fpos<__mbstate_t> *in_RDI;
  streambuf *in_stack_ffffffffffffffc8;
  streampos local_10;
  
  iVar2 = (**(code **)(in_RDI->_M_off + 0x30))();
  if (iVar2 == 0) {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_RSI);
    if (!bVar1) {
      std::streambuf::setg((char *)in_RDI,(char *)0x0,(char *)0x0);
    }
    if (in_EDX == 1) {
      piVar3 = device(in_stack_ffffffffffffffc8);
      (*piVar3->_vptr_io_device[2])(piVar3,in_RSI,1);
      std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffffc8);
    }
    else if (in_EDX == 0) {
      piVar3 = device(in_stack_ffffffffffffffc8);
      (*piVar3->_vptr_io_device[2])(piVar3,in_RSI,0);
      std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffffc8);
    }
    else if (in_EDX == 2) {
      piVar3 = device(in_stack_ffffffffffffffc8);
      (*piVar3->_vptr_io_device[2])(piVar3,in_RSI,2);
      std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffffc8);
    }
    else {
      std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffffc8);
    }
  }
  else {
    std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

std::streampos streambuf::seekoff(	std::streamoff off,
						std::ios_base::seekdir seekdir,
						std::ios_base::openmode /*m*/)
	{
		if(sync())
			return -1;
		if(!buffer_in_.empty()) {
			setg(0,0,0);
		}
		if(seekdir == std::ios_base::cur)
			return device().seek(off,io_device::cur);
		if(seekdir == std::ios_base::beg)
			return device().seek(off,io_device::set);
		if(seekdir == std::ios_base::end)
			return device().seek(off,io_device::end);
		return -1;
	}